

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

optional<Token> * __thiscall
Tokenizer::nextToken(optional<Token> *__return_storage_ptr__,Tokenizer *this)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  Error *pEVar8;
  bool local_c4c;
  allocator<char> local_b91;
  string local_b90;
  allocator<char> local_b69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b68;
  any local_b48;
  Token local_b38;
  char local_b12;
  char local_b11;
  undefined1 local_b10 [6];
  char ch_7;
  Token local_b00;
  allocator<char> local_ad9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  any local_ab8;
  Token local_aa8;
  char local_a82;
  char local_a81;
  undefined1 local_a80 [6];
  char ch_6;
  Token local_a70;
  allocator<char> local_a49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  any local_a28;
  Token local_a18;
  char local_9f2;
  char local_9f1;
  undefined1 local_9f0 [6];
  char ch_5;
  Token local_9e0;
  allocator<char> local_9b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  any local_998;
  Token local_988;
  char local_962;
  char local_961;
  undefined1 local_960 [6];
  char ch_4;
  Token local_950;
  char local_929;
  any local_928;
  Token local_918;
  char local_8f1;
  any local_8f0;
  Token local_8e0;
  char local_8b9;
  any local_8b8;
  Token local_8a8;
  char local_881;
  any local_880;
  Token local_870;
  char local_849;
  any local_848;
  Token local_838;
  char local_811;
  any local_810;
  Token local_800;
  char local_7d9;
  any local_7d8;
  Token local_7c8;
  char local_7a1;
  any local_7a0;
  Token local_790;
  char local_769;
  any local_768;
  Token local_758;
  any local_738;
  Token local_728;
  any local_708;
  Token local_6f8;
  _Self local_6d8;
  _Self local_6d0;
  undefined1 local_6c8 [8];
  string str_1;
  undefined1 local_6a0 [7];
  char ch_3;
  Token local_690;
  any local_670;
  Token local_660;
  _Self local_640;
  _Self local_638;
  undefined1 local_630 [8];
  string str;
  invalid_argument anon_var_0_6;
  out_of_range anon_var_0_7;
  any local_5a0;
  Token local_590;
  string local_570;
  uint32_t local_550;
  char local_54b;
  int ret_3;
  char ch_2;
  invalid_argument anon_var_0_4;
  out_of_range anon_var_0_5;
  any local_4e0;
  Token local_4d0;
  string local_4b0;
  uint32_t local_490 [2];
  int ret_2;
  invalid_argument anon_var_0_2;
  out_of_range anon_var_0_3;
  any local_420;
  Token local_410;
  string local_3f0;
  int local_3d0;
  undefined1 local_3ca;
  allocator<char> local_3c9;
  int ret_1;
  byte local_3a1;
  string local_3a0 [32];
  string local_380 [38];
  undefined1 local_35a;
  allocator<char> local_359;
  string local_358;
  string local_338 [37];
  char local_313;
  char ch_1;
  invalid_argument anon_var_0;
  out_of_range anon_var_0_1;
  any local_2a8;
  Token local_298;
  string local_278;
  int local_258;
  undefined1 local_252;
  allocator<char> local_251;
  int ret;
  byte local_229;
  string local_228 [32];
  string local_208 [38];
  undefined1 local_1e2;
  allocator<char> local_1e1;
  string local_1e0;
  byte local_1ba;
  char local_1b9;
  undefined4 local_1b8;
  bool invalid;
  char ch;
  _Optional_payload_base<char> local_1a6;
  int local_1a4;
  stringstream local_1a0 [2];
  optional<char> current_char;
  DFAState current_state;
  stringstream ss;
  ostream local_190 [376];
  Tokenizer *local_18;
  Tokenizer *this_local;
  
  local_18 = this;
  this_local = (Tokenizer *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = 0;
  do {
    local_1a6 = (_Optional_payload_base<char>)nextChar(this);
    switch(local_1a4) {
    case 0:
      bVar1 = std::optional<char>::has_value((optional<char> *)&local_1a6);
      if (!bVar1) {
        std::optional<Token>::optional(__return_storage_ptr__);
        local_1b8 = 1;
        goto LAB_001234c4;
      }
      pcVar7 = std::optional<char>::value((optional<char> *)&local_1a6);
      local_1b9 = *pcVar7;
      local_1ba = 0;
      uVar4 = miniplc0::isspace((int)local_1b9);
      if ((uVar4 & 1) == 0) {
        uVar4 = miniplc0::isprint((int)local_1b9);
        if ((uVar4 & 1) == 0) {
          local_1ba = 1;
        }
        else {
          uVar4 = miniplc0::isdigit((int)local_1b9);
          if ((uVar4 & 1) == 0) {
            uVar4 = miniplc0::isalpha((int)local_1b9);
            if ((uVar4 & 1) == 0) {
              switch(local_1b9) {
              case '!':
                local_1a4 = 0xf;
                break;
              default:
                local_1ba = 1;
                break;
              case '(':
                local_1a4 = 9;
                break;
              case ')':
                local_1a4 = 10;
                break;
              case '*':
                local_1a4 = 5;
                break;
              case '+':
                local_1a4 = 2;
                break;
              case ',':
                local_1a4 = 0x10;
                break;
              case '-':
                local_1a4 = 3;
                break;
              case '/':
                local_1a4 = 4;
                break;
              case ';':
                local_1a4 = 8;
                break;
              case '<':
                local_1a4 = 0xc;
                break;
              case '=':
                local_1a4 = 7;
                break;
              case '>':
                local_1a4 = 0xb;
                break;
              case '{':
                local_1a4 = 0xd;
                break;
              case '}':
                local_1a4 = 0xe;
              }
            }
            else {
              local_1a4 = 6;
            }
          }
          else {
            local_1a4 = 1;
          }
        }
      }
      else {
        local_1a4 = 0;
      }
      if ((local_1ba & 1) != 0) {
        unreadLast(this);
        local_1e2 = 1;
        pEVar8 = (Error *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e0,"InvalidInputErr",&local_1e1);
        Error::Error(pEVar8,&local_1e0,(this->_ptr).first + 1);
        local_1e2 = 0;
        __cxa_throw(pEVar8,&Error::typeinfo,Error::~Error);
      }
      if (local_1a4 != 0) {
        std::operator<<(local_190,local_1b9);
      }
      break;
    case 1:
      bVar1 = std::optional<char>::has_value((optional<char> *)&local_1a6);
      if (!bVar1) {
        local_229 = 0;
        std::__cxx11::stringstream::str();
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_208);
        bVar1 = false;
        if (*pcVar7 == '0') {
          std::__cxx11::stringstream::str();
          local_229 = 1;
          uVar5 = std::__cxx11::string::size();
          bVar1 = 1 < uVar5;
        }
        if ((local_229 & 1) != 0) {
          std::__cxx11::string::~string(local_228);
        }
        std::__cxx11::string::~string(local_208);
        if (bVar1) {
          local_252 = 1;
          pEVar8 = (Error *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ret,"StartWithZeroErr",&local_251);
          Error::Error(pEVar8,(string *)&ret,(this->_ptr).first + 1);
          local_252 = 0;
          __cxa_throw(pEVar8,&Error::typeinfo,Error::~Error);
        }
        std::__cxx11::stringstream::str();
        iVar2 = std::__cxx11::stoi(&local_278,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&local_278);
        local_258 = iVar2;
        std::any::any<int&,int,std::any::_Manager_internal<int>,void>(&local_2a8,&local_258);
        Token::Token(&local_298,UNSIGNED_INTEGER,&local_2a8,(this->_ptr).first + 1);
        std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_298);
        Token::~Token(&local_298);
        std::any::~any(&local_2a8);
        local_1b8 = 1;
        goto LAB_001234c4;
      }
      pcVar7 = std::optional<char>::value((optional<char> *)&local_1a6);
      local_313 = *pcVar7;
      uVar4 = miniplc0::isdigit((int)local_313);
      if ((uVar4 & 1) == 0) {
        uVar4 = miniplc0::isalpha((int)local_313);
        if ((uVar4 & 1) == 0) {
          unreadLast(this);
          local_3a1 = 0;
          std::__cxx11::stringstream::str();
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_380);
          bVar1 = false;
          if (*pcVar7 == '0') {
            std::__cxx11::stringstream::str();
            local_3a1 = 1;
            uVar5 = std::__cxx11::string::size();
            bVar1 = 1 < uVar5;
          }
          if ((local_3a1 & 1) != 0) {
            std::__cxx11::string::~string(local_3a0);
          }
          std::__cxx11::string::~string(local_380);
          if (bVar1) {
            local_3ca = 1;
            pEVar8 = (Error *)__cxa_allocate_exception(0x28);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&ret_1,"StartWithZeroErr",&local_3c9);
            Error::Error(pEVar8,(string *)&ret_1,(this->_ptr).first + 1);
            local_3ca = 0;
            __cxa_throw(pEVar8,&Error::typeinfo,Error::~Error);
          }
          std::__cxx11::stringstream::str();
          iVar2 = std::__cxx11::stoi(&local_3f0,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&local_3f0);
          local_3d0 = iVar2;
          std::any::any<int&,int,std::any::_Manager_internal<int>,void>(&local_420,&local_3d0);
          Token::Token(&local_410,UNSIGNED_INTEGER,&local_420,(this->_ptr).first + 1);
          std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_410);
          Token::~Token(&local_410);
          std::any::~any(&local_420);
          local_1b8 = 1;
          goto LAB_001234c4;
        }
        std::operator<<(local_190,local_313);
        std::__cxx11::stringstream::str();
        lVar6 = std::__cxx11::string::size();
        local_c4c = false;
        if (lVar6 == 2) {
          local_c4c = local_313 == 'x' || local_313 == 'X';
        }
        std::__cxx11::string::~string(local_338);
        if (!local_c4c) {
          local_35a = 1;
          pEVar8 = (Error *)__cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,"InvalidInputErr",&local_359);
          Error::Error(pEVar8,&local_358,(this->_ptr).first + 1);
          local_35a = 0;
          __cxa_throw(pEVar8,&Error::typeinfo,Error::~Error);
        }
        local_1a4 = 0x11;
      }
      else {
        std::operator<<(local_190,local_313);
      }
      break;
    case 2:
      unreadLast(this);
      local_769 = '+';
      std::any::any<char,char,std::any::_Manager_internal<char>,void>(&local_768,&local_769);
      Token::Token(&local_758,PLUS_SIGN,&local_768,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_758);
      Token::~Token(&local_758);
      std::any::~any(&local_768);
      local_1b8 = 1;
LAB_001234c4:
      std::__cxx11::stringstream::~stringstream(local_1a0);
      return __return_storage_ptr__;
    case 3:
      unreadLast(this);
      local_7a1 = '-';
      std::any::any<char,char,std::any::_Manager_internal<char>,void>(&local_7a0,&local_7a1);
      Token::Token(&local_790,MINUS_SIGN,&local_7a0,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_790);
      Token::~Token(&local_790);
      std::any::~any(&local_7a0);
      local_1b8 = 1;
      goto LAB_001234c4;
    case 4:
      unreadLast(this);
      local_811 = '/';
      std::any::any<char,char,std::any::_Manager_internal<char>,void>(&local_810,&local_811);
      Token::Token(&local_800,DIVISION_SIGN,&local_810,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_800);
      Token::~Token(&local_800);
      std::any::~any(&local_810);
      local_1b8 = 1;
      goto LAB_001234c4;
    case 5:
      unreadLast(this);
      local_7d9 = '*';
      std::any::any<char,char,std::any::_Manager_internal<char>,void>(&local_7d8,&local_7d9);
      Token::Token(&local_7c8,MULTIPLICATION_SIGN,&local_7d8,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_7c8);
      Token::~Token(&local_7c8);
      std::any::~any(&local_7d8);
      local_1b8 = 1;
      goto LAB_001234c4;
    case 6:
      bVar1 = std::optional<char>::has_value((optional<char> *)&local_1a6);
      if (!bVar1) {
        std::__cxx11::stringstream::str();
        local_638._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&ReservedWords_abi_cxx11_,(key_type *)local_630);
        local_640._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&ReservedWords_abi_cxx11_);
        bVar1 = std::operator!=(&local_638,&local_640);
        if (bVar1) {
          std::any::
          any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                    (&local_670,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630)
          ;
          Token::Token(&local_660,RESERVED_WORD,&local_670,(this->_ptr).first + 1);
          std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_660);
          Token::~Token(&local_660);
          std::any::~any(&local_670);
        }
        else {
          std::any::
          any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                    ((any *)local_6a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630)
          ;
          Token::Token(&local_690,IDENTIFIER,(any *)local_6a0,(this->_ptr).first + 1);
          std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_690);
          Token::~Token(&local_690);
          std::any::~any((any *)local_6a0);
        }
        local_1b8 = 1;
        std::__cxx11::string::~string((string *)local_630);
        goto LAB_001234c4;
      }
      pcVar7 = std::optional<char>::value((optional<char> *)&local_1a6);
      str_1.field_2._M_local_buf[0xf] = *pcVar7;
      uVar4 = miniplc0::isalpha((int)str_1.field_2._M_local_buf[0xf]);
      if (((uVar4 & 1) == 0) &&
         (uVar4 = miniplc0::isdigit((int)str_1.field_2._M_local_buf[0xf]), (uVar4 & 1) == 0)) {
        unreadLast(this);
        std::__cxx11::stringstream::str();
        local_6d0._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&ReservedWords_abi_cxx11_,(key_type *)local_6c8);
        local_6d8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&ReservedWords_abi_cxx11_);
        bVar1 = std::operator!=(&local_6d0,&local_6d8);
        if (bVar1) {
          std::any::
          any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                    (&local_708,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8)
          ;
          Token::Token(&local_6f8,RESERVED_WORD,&local_708,(this->_ptr).first + 1);
          std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_6f8);
          Token::~Token(&local_6f8);
          std::any::~any(&local_708);
        }
        else {
          std::any::
          any<std::__cxx11::string&,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                    (&local_738,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8)
          ;
          Token::Token(&local_728,IDENTIFIER,&local_738,(this->_ptr).first + 1);
          std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_728);
          Token::~Token(&local_728);
          std::any::~any(&local_738);
        }
        local_1b8 = 1;
        std::__cxx11::string::~string((string *)local_6c8);
        goto LAB_001234c4;
      }
      std::operator<<(local_190,str_1.field_2._M_local_buf[0xf]);
      break;
    case 7:
      pcVar7 = std::optional<char>::value((optional<char> *)&local_1a6);
      local_962 = *pcVar7;
      if (local_962 == '=') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b8,"==",&local_9b9);
        std::any::
        any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                  (&local_998,&local_9b8);
        Token::Token(&local_988,EQUAL_SIGN,&local_998,(this->_ptr).first + 1);
        std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_988);
        Token::~Token(&local_988);
        std::any::~any(&local_998);
        std::__cxx11::string::~string((string *)&local_9b8);
        std::allocator<char>::~allocator(&local_9b9);
        local_1b8 = 1;
      }
      else {
        unreadLast(this);
        local_9f1 = '=';
        std::any::any<char,char,std::any::_Manager_internal<char>,void>((any *)local_9f0,&local_9f1)
        ;
        Token::Token(&local_9e0,ASSIGNMENT_SIGN,(any *)local_9f0,(this->_ptr).first + 1);
        std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_9e0);
        Token::~Token(&local_9e0);
        std::any::~any((any *)local_9f0);
        local_1b8 = 1;
      }
      goto LAB_001234c4;
    case 8:
      unreadLast(this);
      local_849 = ';';
      std::any::any<char,char,std::any::_Manager_internal<char>,void>(&local_848,&local_849);
      Token::Token(&local_838,SEMICOLON,&local_848,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_838);
      Token::~Token(&local_838);
      std::any::~any(&local_848);
      local_1b8 = 1;
      goto LAB_001234c4;
    case 9:
      unreadLast(this);
      local_881 = '(';
      std::any::any<char,char,std::any::_Manager_internal<char>,void>(&local_880,&local_881);
      Token::Token(&local_870,LEFT_BRACKET,&local_880,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_870);
      Token::~Token(&local_870);
      std::any::~any(&local_880);
      local_1b8 = 1;
      goto LAB_001234c4;
    case 10:
      unreadLast(this);
      local_8b9 = ')';
      std::any::any<char,char,std::any::_Manager_internal<char>,void>(&local_8b8,&local_8b9);
      Token::Token(&local_8a8,RIGHT_BRACKET,&local_8b8,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_8a8);
      Token::~Token(&local_8a8);
      std::any::~any(&local_8b8);
      local_1b8 = 1;
      goto LAB_001234c4;
    case 0xb:
      pcVar7 = std::optional<char>::value((optional<char> *)&local_1a6);
      local_9f2 = *pcVar7;
      if (local_9f2 == '=') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a48,">=",&local_a49);
        std::any::
        any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                  (&local_a28,&local_a48);
        Token::Token(&local_a18,GREATER_THAN_EQUAL_SIGH,&local_a28,(this->_ptr).first + 1);
        std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_a18);
        Token::~Token(&local_a18);
        std::any::~any(&local_a28);
        std::__cxx11::string::~string((string *)&local_a48);
        std::allocator<char>::~allocator(&local_a49);
        local_1b8 = 1;
      }
      else {
        unreadLast(this);
        local_a81 = '{';
        std::any::any<char,char,std::any::_Manager_internal<char>,void>((any *)local_a80,&local_a81)
        ;
        Token::Token(&local_a70,GREATER_THAN_SIGH,(any *)local_a80,(this->_ptr).first + 1);
        std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_a70);
        Token::~Token(&local_a70);
        std::any::~any((any *)local_a80);
        local_1b8 = 1;
      }
      goto LAB_001234c4;
    case 0xc:
      pcVar7 = std::optional<char>::value((optional<char> *)&local_1a6);
      local_a82 = *pcVar7;
      if (local_a82 == '=') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad8,"<=",&local_ad9);
        std::any::
        any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                  (&local_ab8,&local_ad8);
        Token::Token(&local_aa8,LESS_THAN_EQUAL_SIGH,&local_ab8,(this->_ptr).first + 1);
        std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_aa8);
        Token::~Token(&local_aa8);
        std::any::~any(&local_ab8);
        std::__cxx11::string::~string((string *)&local_ad8);
        std::allocator<char>::~allocator(&local_ad9);
        local_1b8 = 1;
      }
      else {
        unreadLast(this);
        local_b11 = '<';
        std::any::any<char,char,std::any::_Manager_internal<char>,void>((any *)local_b10,&local_b11)
        ;
        Token::Token(&local_b00,LESS_THAN_SIGH,(any *)local_b10,(this->_ptr).first + 1);
        std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_b00);
        Token::~Token(&local_b00);
        std::any::~any((any *)local_b10);
        local_1b8 = 1;
      }
      goto LAB_001234c4;
    case 0xd:
      unreadLast(this);
      local_929 = '{';
      std::any::any<char,char,std::any::_Manager_internal<char>,void>(&local_928,&local_929);
      Token::Token(&local_918,LEFT_BRACE,&local_928,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_918);
      Token::~Token(&local_918);
      std::any::~any(&local_928);
      local_1b8 = 1;
      goto LAB_001234c4;
    case 0xe:
      unreadLast(this);
      local_961 = '}';
      std::any::any<char,char,std::any::_Manager_internal<char>,void>((any *)local_960,&local_961);
      Token::Token(&local_950,RIGHT_BRACE,(any *)local_960,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_950);
      Token::~Token(&local_950);
      std::any::~any((any *)local_960);
      local_1b8 = 1;
      goto LAB_001234c4;
    case 0xf:
      pcVar7 = std::optional<char>::value((optional<char> *)&local_1a6);
      local_b12 = *pcVar7;
      if (local_b12 != '=') {
        pEVar8 = (Error *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b90,"InvalidInputErr",&local_b91);
        Error::Error(pEVar8,&local_b90,(this->_ptr).first + 1);
        __cxa_throw(pEVar8,&Error::typeinfo,Error::~Error);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b68,"!=",&local_b69);
      std::any::
      any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
                (&local_b48,&local_b68);
      Token::Token(&local_b38,UNEQUAL_SIGN,&local_b48,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_b38);
      Token::~Token(&local_b38);
      std::any::~any(&local_b48);
      std::__cxx11::string::~string((string *)&local_b68);
      std::allocator<char>::~allocator(&local_b69);
      local_1b8 = 1;
      goto LAB_001234c4;
    case 0x10:
      unreadLast(this);
      local_8f1 = ',';
      std::any::any<char,char,std::any::_Manager_internal<char>,void>(&local_8f0,&local_8f1);
      Token::Token(&local_8e0,COMMA_SIGH,&local_8f0,(this->_ptr).first + 1);
      std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_8e0);
      Token::~Token(&local_8e0);
      std::any::~any(&local_8f0);
      local_1b8 = 1;
      goto LAB_001234c4;
    case 0x11:
      bVar1 = std::optional<char>::has_value((optional<char> *)&local_1a6);
      if (!bVar1) {
        std::__cxx11::stringstream::str();
        uVar3 = htoi(&local_4b0);
        std::__cxx11::string::~string((string *)&local_4b0);
        local_490[0] = uVar3;
        std::any::any<int&,int,std::any::_Manager_internal<int>,void>(&local_4e0,(int *)local_490);
        Token::Token(&local_4d0,UNSIGNED_INTEGER,&local_4e0,(this->_ptr).first + 1);
        std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_4d0);
        Token::~Token(&local_4d0);
        std::any::~any(&local_4e0);
        local_1b8 = 1;
        goto LAB_001234c4;
      }
      pcVar7 = std::optional<char>::value((optional<char> *)&local_1a6);
      local_54b = *pcVar7;
      bVar1 = miniplc0::ishexadecimal(local_54b);
      if (!bVar1) {
        unreadLast(this);
        std::__cxx11::stringstream::str();
        uVar3 = htoi(&local_570);
        std::__cxx11::string::~string((string *)&local_570);
        local_550 = uVar3;
        std::any::any<int&,int,std::any::_Manager_internal<int>,void>(&local_5a0,(int *)&local_550);
        Token::Token(&local_590,UNSIGNED_INTEGER,&local_5a0,(this->_ptr).first + 1);
        std::optional<Token>::optional<Token,_true>(__return_storage_ptr__,&local_590);
        Token::~Token(&local_590);
        std::any::~any(&local_5a0);
        local_1b8 = 1;
        goto LAB_001234c4;
      }
      std::operator<<(local_190,local_54b);
    }
  } while( true );
}

Assistant:

std::optional<Token> Tokenizer::nextToken() {
	std::stringstream ss;
	DFAState current_state = DFAState::INITIAL_STATE;
	while (true) {
		auto current_char = nextChar();
		switch (current_state)
		{
		case DFAState::INITIAL_STATE: {
			//�����ļ�β
			if (!current_char.has_value()) {
				return {};
			}

			auto ch = current_char.value();
			// �����Ƿ������˲��Ϸ����ַ�����ʼ��Ϊ��
			auto invalid = false;

			if (miniplc0::isspace(ch)) // �������ַ��ǿհ��ַ����ո񡢻��С��Ʊ����ȣ�
				current_state = DFAState::INITIAL_STATE;
			else if (!miniplc0::isprint(ch)) // control codes and backspace
				invalid = true;
			else if (miniplc0::isdigit(ch))
				current_state = DFAState::UNSIGNED_INTEGER_STATE;
			else if (miniplc0::isalpha(ch))
				current_state = DFAState::IDENTIFIER_STATE;
			else {
				switch (ch) {
				case '=':
					current_state = DFAState::EQUAL_SIGN_STATE;
					break;
				case '-':
					current_state = DFAState::MINUS_SIGN_STATE;
					break;
				case '+':
					current_state = DFAState::PLUS_SIGN_STATE;
					break;
				case '*':
					current_state = DFAState::MULTIPLICATION_SIGN_STATE;
					break;
				case '/':
					current_state = DFAState::DIVISION_SIGN_STATE;
					break;
				case ';':
					current_state = DFAState::SEMICOLON_STATE;
					break;
				case '(':
					current_state = DFAState::LEFTBRACKET_STATE;
					break;
				case ')':
					current_state = DFAState::RIGHTBRACKET_STATE;
					break;

					//��min0�Ļ�����������6��״̬
				case '>':
					current_state = DFAState::GREATER_THAN_STATE;
					break;
				case '<':
					current_state = DFAState::LESS_THAN_STATE;
					break;
				case '{':
					current_state = DFAState::LEFTBRACE_STATE;
					break;
				case '}':
					current_state = DFAState::RIGHTBRACE_STATE;
					break;
				case '!':
					current_state = DFAState::EXCLAMATION_SIGH_STATE;
					break;
				case ',':
					current_state = DFAState::COMMA_STATE;
					break;

					// �����ܵ��ַ����µĲ��Ϸ���״̬
				default:
					invalid = true;
					break;
				}
			}
			if (invalid) {
				unreadLast();
				throw Error("InvalidInputErr", _ptr.first + 1);
			}
			// �����������ַ�������״̬��ת�ƣ�˵������һ��token�ĵ�һ���ַ�
			if (current_state != DFAState::INITIAL_STATE) // ignore white spaces
				ss << ch; // �洢�������ַ�
			break;
		}
		case DFAState::UNSIGNED_INTEGER_STATE: {
			// ������ǰ�Ѿ��������ļ�β���������Ѿ��������ַ���Ϊ����
			//     �����ɹ��򷵻��޷����������͵�token�����򷵻ر�������
			// �����������ַ������֣����洢�������ַ�
			// ��������������ĸ�������Ƿ�Ϊx�Լ�����λ�÷���ʮ����������תΪʮ��������״̬��������������
			// �����������ַ�������������֮һ�������˶������ַ����������Ѿ��������ַ���Ϊ����
			//     �����ɹ��򷵻��޷����������͵�token�����򷵻ر�������
			if (!current_char.has_value()) {
				if (ss.str()[0] == '0' && ss.str().size() > 1) {
					throw Error("StartWithZeroErr", _ptr.first + 1);
				}
				try {
					int ret = std::stoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::isdigit(ch)) {
				ss << ch;
			}
			else if (miniplc0::isalpha(ch)) {
				ss << ch;
				if (ss.str().size() == 2 && (ch == 'x' || ch == 'X')) {
					current_state = DFAState::HEXADECIMAL_STATE;
				}
				else {
					throw Error("InvalidInputErr", _ptr.first + 1);
				}
			}
			else {
				unreadLast();
				if (ss.str()[0] == '0' && ss.str().size() > 1) {
					throw Error("StartWithZeroErr", _ptr.first + 1);
				}
				try {
					int ret = std::stoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::HEXADECIMAL_STATE: {
			if (!current_char.has_value()) {
				try {
					int ret = htoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::ishexadecimal(ch)) {
				ss << ch;
			}
			else {
				unreadLast();
				try {
					int ret = htoi(ss.str());
					return Token(TokenType::UNSIGNED_INTEGER, ret, _ptr.first + 1);
				}
				catch (std::invalid_argument) {
					throw Error("InvalidAgumentErr", _ptr.first + 1);
				}
				catch (std::out_of_range) {
					throw Error("IntegerOverflowErr", _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::IDENTIFIER_STATE: {
			// ������ǰ�Ѿ��������ļ�β���������Ѿ��������ַ���
			//     �������������ǹؼ��֣���ô���ض�Ӧ�ؼ��ֵ�token�����򷵻ر�ʶ����token
			// �������������ַ�����ĸ�����洢�������ַ�
			// �����������ַ�������������֮һ�������˶������ַ����������Ѿ��������ַ���
			//     �������������ǹؼ��֣���ô���ض�Ӧ�ؼ��ֵ�token�����򷵻ر�ʶ����token

			if (!current_char.has_value()) {
				std::string str = ss.str();
				if (ReservedWords.find(str) != ReservedWords.end()) {
					return Token(TokenType::RESERVED_WORD, str, _ptr.first + 1);
				}
				else {
					return Token(TokenType::IDENTIFIER, str, _ptr.first + 1);
				}
			}
			auto ch = current_char.value();
			if (miniplc0::isalpha(ch) || miniplc0::isdigit(ch)) {
				ss << ch;
			}
			else {
				unreadLast();
				std::string str = ss.str();
				if (ReservedWords.find(str) != ReservedWords.end()) {
					return Token(TokenType::RESERVED_WORD, str, _ptr.first + 1);
				}
				else {
					return Token(TokenType::IDENTIFIER, str, _ptr.first + 1);
				}
			}
			break;
		}
		case DFAState::PLUS_SIGN_STATE: {
			unreadLast(); // Yes, we unread last char even if it's an EOF.
			return Token(TokenType::PLUS_SIGN, '+', _ptr.first + 1);
		}
		case DFAState::MINUS_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::MINUS_SIGN, '-', _ptr.first + 1);
		}
		case DFAState::MULTIPLICATION_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::MULTIPLICATION_SIGN, '*', _ptr.first + 1);
		}
		case DFAState::DIVISION_SIGN_STATE: {
			unreadLast();
			return Token(TokenType::DIVISION_SIGN, '/', _ptr.first + 1);
		}
		case DFAState::SEMICOLON_STATE: {
			unreadLast();
			return Token(TokenType::SEMICOLON, ';', _ptr.first + 1);
		}
		case DFAState::LEFTBRACKET_STATE: {
			unreadLast();
			return Token(TokenType::LEFT_BRACKET, '(', _ptr.first + 1);
		}
		case DFAState::RIGHTBRACKET_STATE: {
			unreadLast();
			return Token(TokenType::RIGHT_BRACKET, ')', _ptr.first + 1);
		}

										 //c0�ķ�
		case DFAState::COMMA_STATE: {
			unreadLast();
			return Token(TokenType::COMMA_SIGH, ',', _ptr.first + 1);
		}
		case DFAState::LEFTBRACE_STATE: {
			unreadLast();
			return Token(TokenType::LEFT_BRACE, '{', _ptr.first + 1);
		}
		case DFAState::RIGHTBRACE_STATE: {
			unreadLast();
			return Token(TokenType::RIGHT_BRACE, '}', _ptr.first + 1);
		}
		case DFAState::EQUAL_SIGN_STATE: {
			//= & ==
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::EQUAL_SIGN, std::string("=="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::ASSIGNMENT_SIGN, '=', _ptr.first + 1);
			}
		}
		case DFAState::GREATER_THAN_STATE: {
			//> & >=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::GREATER_THAN_EQUAL_SIGH, std::string(">="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::GREATER_THAN_SIGH, '{', _ptr.first + 1);
			}
		}
		case DFAState::LESS_THAN_STATE: {
			//< & <=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::LESS_THAN_EQUAL_SIGH, std::string("<="), _ptr.first + 1);
			}
			else {
				unreadLast();
				return Token(TokenType::LESS_THAN_SIGH, '<', _ptr.first + 1);
			}
		}
		case DFAState::EXCLAMATION_SIGH_STATE: {
			//!=
			auto ch = current_char.value();
			if (ch == '=') {
				return Token(TokenType::UNEQUAL_SIGN, std::string("!="), _ptr.first + 1);
			}
			else {
				throw Error("InvalidInputErr", _ptr.first + 1);
			}
		}
		default:
			break;
		}
	}
}